

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::RsRepeatSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,RsRepeatSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (RsRepeatSyntax *)0x0:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[1].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (RsRepeatSyntax *)0x1:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[2].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (RsRepeatSyntax *)0x2:
    return *(PtrTokenOrSyntax **)
            ((long)&__return_storage_ptr__[3].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  case (RsRepeatSyntax *)0x3:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 4);
    break;
  case (RsRepeatSyntax *)0x4:
    return *(PtrTokenOrSyntax **)
            &__return_storage_ptr__[5].
             super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax RsRepeatSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &keyword;
        case 1: return &openParen;
        case 2: return expr.get();
        case 3: return &closeParen;
        case 4: return item.get();
        default: return nullptr;
    }
}